

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall trun::Config::Config(Config *this)

{
  ILogger *pIVar1;
  allocator<char> local_71 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_40;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  local_40 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->testcases;
  (this->inputs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->testcases).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->testcases).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->modules).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->testcases).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->modules).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->modules).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inputs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->version)._M_dataplus._M_p = (pointer)&(this->version).field_2;
  (this->version)._M_string_length = 0;
  local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->inputs;
  (this->version).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  local_48 = &this->version;
  (this->description).field_2._M_local_buf[0] = '\0';
  (this->appName)._M_dataplus._M_p = (pointer)&(this->appName).field_2;
  (this->appName)._M_string_length = 0;
  (this->appName).field_2._M_local_buf[0] = '\0';
  this->verbose = 0;
  this->responseMsgByteLimit = 0x2000;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->mainFuncName,"main",(allocator<char> *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->exitFuncName,"exit",(allocator<char> *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->reportingModule,"console",(allocator<char> *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->reportFile,"-",(allocator<char> *)&local_68);
  this->reportIndent = 8;
  this->executeTests = true;
  this->listTests = false;
  this->printPassSummary = false;
  this->testModuleGlobals = true;
  this->testGlobalMain = true;
  this->testLogFilter = false;
  this->skipOnModuleFail = true;
  this->stopOnAllFail = true;
  this->suppressProgressMsg = false;
  this->discardTestReturnCode = false;
  this->linuxUseDeepBinding = true;
  *(undefined8 *)&this->continueOnAssert = 0;
  *(undefined2 *)((long)&this->moduleExecuteType + 3) = 0;
  this->useITestingVersion = 1;
  this->pLogger = (ILogger *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,".",local_71);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_38,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"-",local_71);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"-",local_71);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_40,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (local_48,"<unknown>");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&this->description,"C/C++ Unit Test Runner");
  this->testExecutionType = kSequential;
  this->moduleExecuteType = kSequential;
  gnilk::Logger::Initialize();
  gnilk::Logger::SetAllSinkDebugLevel(100);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"main",local_71);
  pIVar1 = gnilk::Logger::GetLogger(&local_68);
  this->pLogger = pIVar1;
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

Config::Config() {
    // set default
    inputs.push_back(".");    // Search current directory
    modules.push_back("-");
    testcases.push_back("-");
#ifdef TRUN_VERSION
    version = TRUN_VERSION;
#else
    version = "<unknown>";
#endif
    description = "C/C++ Unit Test Runner";
#ifdef TRUN_HAVE_FORK
    testExecutionType = TestExecutiontype::kThreaded;
    moduleExecuteType = ModuleExecutionType::kParallel;
#else
    testExecutionType = TestExecutiontype::kSequential;
    moduleExecuteType = ModuleExecutionType::kSequential;
#endif

    //
    // Setup logger
    //
    auto logLevel = gnilk::LogLevel::kDebug;
	gnilk::Logger::Initialize();
	//if (logLevel != gnilk::LogLevel::kNone) {
        // Note: Console already added
        //auto consoleSink = gnilk::LogConsoleSink::Create();
        //gnilk::Logger::AddSink(consoleSink, "Console");
		//gnilk::Logger::AddSink(gnilk::Logger::CreateSink("LogConsoleSink"), "console", 0, NULL);
	//}
	gnilk::Logger::SetAllSinkDebugLevel(logLevel);
    pLogger = gnilk::Logger::GetLogger("main");
}